

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.cpp
# Opt level: O3

void __thiscall
llvm::SmallPtrSetImplBase::MoveHelper
          (SmallPtrSetImplBase *this,uint SmallSize,SmallPtrSetImplBase *RHS)

{
  uint uVar1;
  void **ppvVar2;
  void **__src;
  
  if (RHS == this) {
    __assert_fail("&RHS != this && \"Self-move should be handled by the caller.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SmallPtrSet.cpp"
                  ,0xbf,
                  "void llvm::SmallPtrSetImplBase::MoveHelper(unsigned int, SmallPtrSetImplBase &&)"
                 );
  }
  __src = RHS->SmallArray;
  ppvVar2 = RHS->CurArray;
  if (ppvVar2 == __src) {
    this->CurArray = this->SmallArray;
    __src = RHS->CurArray;
    if ((ulong)RHS->NumNonEmpty != 0) {
      memmove(this->SmallArray,__src,(ulong)RHS->NumNonEmpty << 3);
      ppvVar2 = RHS->SmallArray;
      __src = RHS->CurArray;
    }
  }
  else {
    this->CurArray = ppvVar2;
    RHS->CurArray = __src;
    ppvVar2 = __src;
  }
  uVar1 = RHS->NumNonEmpty;
  this->CurArraySize = RHS->CurArraySize;
  this->NumNonEmpty = uVar1;
  this->NumTombstones = RHS->NumTombstones;
  RHS->CurArraySize = SmallSize;
  if (__src != ppvVar2) {
    __assert_fail("RHS.CurArray == RHS.SmallArray",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SmallPtrSet.cpp"
                  ,0xd1,
                  "void llvm::SmallPtrSetImplBase::MoveHelper(unsigned int, SmallPtrSetImplBase &&)"
                 );
  }
  RHS->NumNonEmpty = 0;
  RHS->NumTombstones = 0;
  return;
}

Assistant:

void SmallPtrSetImplBase::MoveHelper(unsigned SmallSize,
                                     SmallPtrSetImplBase &&RHS) {
  assert(&RHS != this && "Self-move should be handled by the caller.");

  if (RHS.isSmall()) {
    // Copy a small RHS rather than moving.
    CurArray = SmallArray;
    std::copy(RHS.CurArray, RHS.CurArray + RHS.NumNonEmpty, CurArray);
  } else {
    CurArray = RHS.CurArray;
    RHS.CurArray = RHS.SmallArray;
  }

  // Copy the rest of the trivial members.
  CurArraySize = RHS.CurArraySize;
  NumNonEmpty = RHS.NumNonEmpty;
  NumTombstones = RHS.NumTombstones;

  // Make the RHS small and empty.
  RHS.CurArraySize = SmallSize;
  assert(RHS.CurArray == RHS.SmallArray);
  RHS.NumNonEmpty = 0;
  RHS.NumTombstones = 0;
}